

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restincurl.h
# Opt level: O0

void __thiscall restincurl::Worker::Enqueue(Worker *this,ptr_t *req)

{
  lock_guard<std::mutex> local_20;
  lock_t lock;
  ptr_t *req_local;
  Worker *this_local;
  
  lock._M_device = (mutex_type *)req;
  std::lock_guard<std::mutex>::lock_guard(&local_20,&this->mutex_);
  PrepareThread(this);
  std::
  deque<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>,_std::allocator<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>_>_>
  ::push_back(&this->queue_,req);
  Signal(this);
  std::lock_guard<std::mutex>::~lock_guard(&local_20);
  return;
}

Assistant:

void Enqueue(Request::ptr_t req) {
            RESTINCURL_LOG_TRACE("Queuing request ");
            lock_t lock(mutex_);
            PrepareThread();
            queue_.push_back(std::move(req));
            Signal();
        }